

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O3

Extra_BitMat_t * Extra_BitMatrixStart(int nSize)

{
  Extra_BitMat_t *pEVar1;
  uint **ppuVar2;
  uint *puVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = 1;
  pEVar1 = (Extra_BitMat_t *)calloc(1,0x28);
  pEVar1->nSize = nSize;
  pEVar1->nBitShift = 5;
  pEVar1->uMask = 0x1f;
  uVar4 = (ulong)nSize;
  iVar5 = ((int)(uVar4 >> 5) + 1) - (uint)((nSize & 0x1fU) == 0);
  pEVar1->nWords = iVar5;
  ppuVar2 = (uint **)malloc(uVar4 * 8);
  pEVar1->ppData = ppuVar2;
  puVar3 = (uint *)malloc((long)(iVar5 * nSize) << 2);
  *ppuVar2 = puVar3;
  memset(puVar3,0,uVar4 * (long)iVar5 * 4);
  if (1 < nSize) {
    puVar3 = *ppuVar2;
    do {
      puVar3 = puVar3 + iVar5;
      ppuVar2[uVar6] = puVar3;
      uVar6 = uVar6 + 1;
    } while ((uint)nSize != uVar6);
  }
  return pEVar1;
}

Assistant:

Extra_BitMat_t * Extra_BitMatrixStart( int nSize )
{
    Extra_BitMat_t * p;
    int i;
    p = ABC_ALLOC( Extra_BitMat_t, 1 );
    memset( p, 0, sizeof(Extra_BitMat_t) );
    p->nSize     = nSize;
    p->nBitShift = (sizeof(unsigned) == 4) ?  5:  6;
    p->uMask     = (sizeof(unsigned) == 4) ? 31: 63;
    p->nWords    = nSize / (8 * sizeof(unsigned)) + ((nSize % (8 * sizeof(unsigned))) > 0);
    p->ppData    = ABC_ALLOC( unsigned *, nSize );
    p->ppData[0] = ABC_ALLOC( unsigned, nSize * p->nWords );
    memset( p->ppData[0], 0, sizeof(unsigned) * nSize * p->nWords );
    for ( i = 1; i < nSize; i++ )
        p->ppData[i] = p->ppData[i-1] + p->nWords;
    return p;
}